

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  byte bVar1;
  uchar filterType;
  ulong bytewidth;
  void *pvVar2;
  uchar *puVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uchar *puVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined8 *in_stack_00000008;
  uchar *dummy;
  size_t size [5];
  uchar *attempt_1 [5];
  uchar *attempt [5];
  uchar *local_4f0;
  uchar *local_4a8;
  ulong local_4a0;
  ulong auStack_498 [6];
  long alStack_468 [6];
  LodePNGCompressSettings local_438 [21];
  ulong length;
  
  uVar20 = (ulong)h;
  iVar5 = 0;
  if ((uint)info < 7) {
    iVar5 = *(int *)(&DAT_0012a05c + ((ulong)info & 0xffffffff) * 4);
  }
  iVar5 = iVar5 * (uint)settings;
  uVar9 = w * iVar5 + 7;
  uVar19 = uVar9 >> 3;
  length = (ulong)uVar19;
  bytewidth = (ulong)(iVar5 + 7U >> 3);
  uVar7 = *(uint *)(in_stack_00000008 + 7);
  if ((*(int *)((long)in_stack_00000008 + 0x34) == 0) || (7 < (uint)settings && (uint)info != 3)) {
    if (iVar5 == 0) {
      return 0x1f;
    }
    if (4 < uVar7) {
      switch(uVar7) {
      case 5:
        lVar11 = 0;
        break;
      case 6:
        lVar11 = 0;
        do {
          pvVar2 = malloc(length);
          auStack_498[lVar11] = (ulong)pvVar2;
          if (pvVar2 == (void *)0x0) {
            return 0x53;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        if (h != 0) {
          puVar12 = out + 1;
          uVar21 = 0;
          uVar15 = 0;
          uVar20 = 0;
          puVar16 = (uchar *)0x0;
          do {
            lVar11 = uVar21 * length;
            uVar17 = 0;
            do {
              puVar3 = (uchar *)auStack_498[uVar17];
              filterScanline(puVar3,in + lVar11,puVar16,length,bytewidth,(uchar)uVar17);
              memset(local_438,0,0x400);
              if (7 < uVar9) {
                lVar18 = 0;
                do {
                  (&local_438[0].btype)[puVar3[lVar18]] = (&local_438[0].btype)[puVar3[lVar18]] + 1;
                  lVar18 = lVar18 + 1;
                } while (uVar19 != (uint)lVar18);
              }
              (&local_438[0].btype)[uVar17] = (&local_438[0].btype)[uVar17] + 1;
              lVar18 = 0;
              uVar4 = 0;
              do {
                uVar7 = (&local_438[0].btype)[lVar18];
                uVar10 = (ulong)uVar7;
                if (uVar10 == 0) {
                  lVar8 = 0;
                }
                else {
                  uVar14 = (ulong)(uVar7 >> 0x10);
                  if (0xffff >= uVar7) {
                    uVar14 = uVar10;
                  }
                  lVar8 = (ulong)(0xffff < uVar7) << 4;
                  uVar13 = uVar14;
                  if (0xff < uVar14) {
                    do {
                      lVar8 = lVar8 + 8;
                      uVar14 = uVar13 >> 8;
                      bVar22 = 0xffff < uVar13;
                      uVar13 = uVar14;
                    } while (bVar22);
                  }
                  uVar13 = uVar14;
                  if (0xf < uVar14) {
                    do {
                      lVar8 = lVar8 + 4;
                      uVar14 = uVar13 >> 4;
                      bVar22 = 0xff < uVar13;
                      uVar13 = uVar14;
                    } while (bVar22);
                  }
                  if (1 < uVar14) {
                    do {
                      lVar8 = lVar8 + 1;
                      bVar22 = 3 < uVar14;
                      uVar14 = uVar14 >> 1;
                    } while (bVar22);
                  }
                  lVar8 = lVar8 * uVar10;
                }
                uVar4 = uVar4 + lVar8;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 0x100);
              if (uVar20 < uVar4 || uVar17 == 0) {
                uVar15 = uVar17 & 0xffffffff;
                uVar20 = uVar4;
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != 5);
            out[(length + 1) * uVar21] = (uchar)uVar15;
            if (7 < uVar9) {
              uVar17 = auStack_498[uVar15];
              lVar18 = 0;
              do {
                puVar12[lVar18] = *(uchar *)(uVar17 + lVar18);
                lVar18 = lVar18 + 1;
              } while (uVar19 != (uint)lVar18);
            }
            uVar21 = uVar21 + 1;
            puVar12 = puVar12 + length + 1;
            puVar16 = in + lVar11;
          } while (uVar21 != h);
        }
        lVar11 = 0;
        do {
          free((void *)auStack_498[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        return 0;
      case 7:
        local_438[0]._8_8_ = in_stack_00000008[1];
        local_438[0]._16_8_ = in_stack_00000008[2];
        local_438[0].custom_context = (void *)in_stack_00000008[5];
        local_438[0].use_lz77 = (uint)((ulong)*in_stack_00000008 >> 0x20);
        local_438[0].btype = 1;
        local_438[0].custom_zlib =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        local_438[0].custom_deflate =
             (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0
        ;
        lVar11 = 0;
        do {
          pvVar2 = malloc(length);
          alStack_468[lVar11] = (long)pvVar2;
          if (pvVar2 == (void *)0x0) {
            return 0x53;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        if (h != 0) {
          local_4a0 = (ulong)h;
          puVar12 = out + 1;
          uVar21 = 0;
          uVar15 = 0;
          uVar20 = 0;
          local_4f0 = (uchar *)0x0;
          do {
            lVar11 = uVar21 * length;
            lVar18 = 0;
            uVar17 = 0;
            do {
              puVar16 = (uchar *)alStack_468[uVar17];
              filterScanline(puVar16,in + lVar11,local_4f0,length,bytewidth,(uchar)uVar17);
              auStack_498[uVar17] = 0;
              local_4a8 = (uchar *)0x0;
              if (local_438[0].custom_zlib ==
                  (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr
                   *)0x0) {
                lodepng_zlib_compress
                          (&local_4a8,(size_t *)((long)auStack_498 + lVar18),puVar16,length,
                           local_438);
              }
              else {
                (*local_438[0].custom_zlib)
                          (&local_4a8,(size_t *)((long)auStack_498 + lVar18),puVar16,length,
                           local_438);
              }
              free(local_4a8);
              if (auStack_498[uVar17] < uVar20 || uVar17 == 0) {
                uVar15 = uVar17 & 0xffffffff;
                uVar20 = auStack_498[uVar17];
              }
              uVar17 = uVar17 + 1;
              lVar18 = lVar18 + 8;
            } while (uVar17 != 5);
            out[(length + 1) * uVar21] = (uchar)uVar15;
            if (7 < uVar9) {
              lVar18 = alStack_468[uVar15];
              lVar8 = 0;
              do {
                puVar12[lVar8] = *(uchar *)(lVar18 + lVar8);
                lVar8 = lVar8 + 1;
              } while (uVar19 != (uint)lVar8);
            }
            uVar21 = uVar21 + 1;
            puVar12 = puVar12 + length + 1;
            local_4f0 = in + lVar11;
          } while (uVar21 != local_4a0);
        }
        lVar11 = 0;
        do {
          free((void *)alStack_468[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        return 0;
      case 8:
        if (h == 0) {
          return 0;
        }
        puVar16 = out + 1;
        uVar21 = 0;
        puVar12 = (uchar *)0x0;
        do {
          puVar3 = in;
          filterType = *(uchar *)(in_stack_00000008[8] + uVar21);
          puVar16[-1] = filterType;
          filterScanline(puVar16,puVar3,puVar12,length,bytewidth,filterType);
          uVar21 = uVar21 + 1;
          puVar16 = puVar16 + length + 1;
          in = puVar3 + length;
          puVar12 = puVar3;
        } while (uVar20 != uVar21);
        return 0;
      default:
        return 0x58;
      }
      do {
        pvVar2 = malloc(length);
        *(void **)(&local_438[0].btype + lVar11 * 2) = pvVar2;
        if (pvVar2 == (void *)0x0) {
          return 0x53;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 5);
      if (h != 0) {
        puVar12 = out + 1;
        uVar15 = 0;
        local_4f0 = (uchar *)0x0;
        uVar7 = 0;
        uVar21 = 0;
        do {
          lVar18 = uVar15 * length;
          lVar11 = 0;
LAB_0011a239:
          do {
            uVar6 = uVar7;
            lVar8 = lVar11;
            uVar17 = uVar21;
            puVar16 = *(uchar **)(&local_438[0].btype + lVar8 * 2);
            filterScanline(puVar16,in + lVar18,local_4f0,length,bytewidth,(uchar)lVar8);
            if (lVar8 == 0) {
              uVar21 = 0;
              lVar11 = 1;
              uVar7 = 0;
              if (uVar9 < 8) goto LAB_0011a239;
              lVar11 = 0;
              uVar21 = 0;
              do {
                uVar21 = uVar21 + puVar16[lVar11];
                lVar11 = lVar11 + 1;
              } while (uVar19 != (uint)lVar11);
LAB_0011a2c0:
              if (lVar8 != 0) goto LAB_0011a2c5;
              uVar7 = 0;
            }
            else {
              if (7 < uVar9) {
                lVar11 = 0;
                uVar21 = 0;
                do {
                  bVar1 = puVar16[lVar11];
                  uVar7 = bVar1 ^ 0xff;
                  if (-1 < (char)bVar1) {
                    uVar7 = (uint)bVar1;
                  }
                  uVar21 = uVar21 + uVar7;
                  lVar11 = lVar11 + 1;
                } while (uVar19 != (uint)lVar11);
                goto LAB_0011a2c0;
              }
              uVar21 = 0;
LAB_0011a2c5:
              bVar22 = uVar17 <= uVar21;
              if (bVar22) {
                uVar21 = uVar17;
              }
              if (!bVar22) {
                uVar6 = (uint)lVar8;
              }
              uVar7 = uVar6 & 0xff;
            }
            lVar11 = lVar8 + 1;
          } while (lVar8 + 1 != 5);
          out[(length + 1) * uVar15] = (uchar)uVar7;
          if (7 < uVar9) {
            lVar11 = *(long *)(&local_438[0].btype + (ulong)uVar7 * 2);
            lVar8 = 0;
            do {
              puVar12[lVar8] = *(uchar *)(lVar11 + lVar8);
              lVar8 = lVar8 + 1;
            } while (uVar19 != (uint)lVar8);
          }
          uVar15 = uVar15 + 1;
          puVar12 = puVar12 + length + 1;
          local_4f0 = in + lVar18;
        } while (uVar15 != uVar20);
      }
      lVar11 = 0;
      do {
        free(*(void **)(&local_438[0].btype + lVar11 * 2));
        lVar11 = lVar11 + 1;
      } while (lVar11 != 5);
      return 0;
    }
  }
  else {
    uVar7 = 0;
    if (iVar5 == 0) {
      return 0x1f;
    }
  }
  if (h != 0) {
    puVar16 = out + 1;
    puVar12 = (uchar *)0x0;
    do {
      puVar3 = in;
      puVar16[-1] = (uchar)uVar7;
      filterScanline(puVar16,puVar3,puVar12,length,bytewidth,(uchar)uVar7);
      puVar16 = puVar16 + length + 1;
      uVar20 = uVar20 - 1;
      in = puVar3 + length;
      puVar12 = puVar3;
    } while (uVar20 != 0);
  }
  return 0;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings) {
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7u) / 8u, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7u) / 8u;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy >= LFS_ZERO && strategy <= LFS_FOUR) {
    unsigned char type = (unsigned char)strategy;
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_MINSUM) {
    /*adaptive filtering*/
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    if(!error) {
      for(y = 0; y != h; ++y) {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type) {
          filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0) {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type][x]);
          } else {
            for(x = 0; x != linebytes; ++x) {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type][x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest) {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
      }
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_ENTROPY) {
    size_t sum[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t bestSum = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y) {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type) {
        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type][x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x) {
          sum[type] += count[x] == 0 ? 0 : ilog2(count[x]) * count[x];
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] > bestSum) {
          bestType = type;
          bestSum = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }

    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  } else if(strategy == LFS_PREDEFINED) {
    for(y = 0; y != h; ++y) {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  } else if(strategy == LFS_BRUTE_FORCE) {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    unsigned char* attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type) {
      attempt[type] = (unsigned char*)lodepng_malloc(linebytes);
      if(!attempt[type]) return 83; /*alloc fail*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/ {
      for(type = 0; type != 5; ++type) {
        unsigned testsize = (unsigned)linebytes;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type], &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type], testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest) {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType][x];
    }
    for(type = 0; type != 5; ++type) lodepng_free(attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}